

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr_cnv.cpp
# Opt level: O1

void __thiscall
icu_63::UnicodeString::doCodepageCreate
          (UnicodeString *this,char *codepageData,int32_t dataLength,char *codepage)

{
  char cVar1;
  ushort uVar2;
  bool bVar3;
  UBool UVar4;
  uint in_EAX;
  size_t sVar5;
  char *pcVar6;
  char16_t *us;
  UConverter *unaff_R13;
  int newCapacity;
  StringPiece utf8;
  UErrorCode status;
  undefined8 uStack_38;
  
  if (dataLength < -1) {
    return;
  }
  if (codepageData == (char *)0x0) {
    return;
  }
  sVar5 = (size_t)(uint)dataLength;
  if (dataLength == 0) {
    return;
  }
  uStack_38._0_4_ = in_EAX;
  if (dataLength == -1) {
    sVar5 = strlen(codepageData);
  }
  uStack_38 = (ulong)(uint)uStack_38;
  newCapacity = (int)sVar5;
  if (codepage == (char *)0x0) {
    pcVar6 = ucnv_getDefaultName_63();
    if (*pcVar6 == 'u') {
      if ((pcVar6[1] == 't') && (pcVar6[2] == 'f')) goto LAB_0036f386;
LAB_0036f3f4:
      unaff_R13 = u_getDefaultConverter_63((UErrorCode *)((long)&uStack_38 + 4));
      bVar3 = true;
    }
    else {
      if ((*pcVar6 != 'U') || ((pcVar6[1] != 'T' || (pcVar6[2] != 'F')))) goto LAB_0036f3f4;
LAB_0036f386:
      if (pcVar6[3] == '8') {
        cVar1 = pcVar6[4];
      }
      else {
        if ((pcVar6[3] != '-') || (pcVar6[4] != '8')) goto LAB_0036f3f4;
        cVar1 = pcVar6[5];
      }
      if (cVar1 != '\0') goto LAB_0036f3f4;
      utf8._8_8_ = sVar5 & 0xffffffff;
      utf8.ptr_ = codepageData;
      setToUTF8(this,utf8);
      bVar3 = false;
    }
    if (!bVar3) {
      return;
    }
  }
  else {
    if (*codepage == '\0') {
      UVar4 = cloneArrayIfNeeded(this,newCapacity,newCapacity,'\0',(int32_t **)0x0,'\0');
      if (UVar4 != '\0') {
        if (((this->fUnion).fStackFields.fLengthAndFlags & 2U) == 0) {
          us = (this->fUnion).fFields.fArray;
        }
        else {
          us = (this->fUnion).fStackFields.fBuffer;
        }
        u_charsToUChars_63(codepageData,us,newCapacity);
        uVar2 = (this->fUnion).fStackFields.fLengthAndFlags;
        if (0x3ff < newCapacity) {
          (this->fUnion).fStackFields.fLengthAndFlags = uVar2 | 0xffe0;
          (this->fUnion).fFields.fLength = newCapacity;
          return;
        }
        (this->fUnion).fStackFields.fLengthAndFlags = (ushort)(newCapacity << 5) | uVar2 & 0x1f;
        return;
      }
      goto LAB_0036f40e;
    }
    unaff_R13 = ucnv_open_63(codepage,(UErrorCode *)((long)&uStack_38 + 4));
  }
  if (uStack_38._4_4_ < 1) {
    doCodepageCreate(this,codepageData,newCapacity,unaff_R13,(UErrorCode *)((long)&uStack_38 + 4));
    if (0 < uStack_38._4_4_) {
      setToBogus(this);
    }
    if (codepage == (char *)0x0) {
      u_releaseDefaultConverter_63(unaff_R13);
      return;
    }
    ucnv_close_63(unaff_R13);
    return;
  }
LAB_0036f40e:
  setToBogus(this);
  return;
}

Assistant:

void
UnicodeString::doCodepageCreate(const char *codepageData,
                                int32_t dataLength,
                                const char *codepage)
{
    // if there's nothing to convert, do nothing
    if(codepageData == 0 || dataLength == 0 || dataLength < -1) {
        return;
    }
    if(dataLength == -1) {
        dataLength = (int32_t)uprv_strlen(codepageData);
    }

    UErrorCode status = U_ZERO_ERROR;

    // create the converter
    // if the codepage is the default, use our cache
    // if it is an empty string, then use the "invariant character" conversion
    UConverter *converter;
    if (codepage == 0) {
        const char *defaultName = ucnv_getDefaultName();
        if(UCNV_FAST_IS_UTF8(defaultName)) {
            setToUTF8(StringPiece(codepageData, dataLength));
            return;
        }
        converter = u_getDefaultConverter(&status);
    } else if(*codepage == 0) {
        // use the "invariant characters" conversion
        if(cloneArrayIfNeeded(dataLength, dataLength, FALSE)) {
            u_charsToUChars(codepageData, getArrayStart(), dataLength);
            setLength(dataLength);
        } else {
            setToBogus();
        }
        return;
    } else {
        converter = ucnv_open(codepage, &status);
    }

    // if we failed, set the appropriate flags and return
    if(U_FAILURE(status)) {
        setToBogus();
        return;
    }

    // perform the conversion
    doCodepageCreate(codepageData, dataLength, converter, status);
    if(U_FAILURE(status)) {
        setToBogus();
    }

    // close the converter
    if(codepage == 0) {
        u_releaseDefaultConverter(converter);
    } else {
        ucnv_close(converter);
    }
}